

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O1

bool __thiscall
PruneReplayer::enqueue_create_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  *this_01;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *ppVVar5;
  VkPipelineLibraryCreateInfoKHR *pVVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  VkPipeline local_48;
  PruneReplayer *local_40;
  Hash local_38;
  
  *pipeline = (VkPipeline)hash;
  local_38 = hash;
  bVar2 = filter_object(this,RESOURCE_RAYTRACING_PIPELINE,hash);
  if (bVar2) {
    if (create_info->stageCount != 0) {
      lVar8 = 0x18;
      uVar9 = 0;
      do {
        bVar2 = filter_shader_module(this,*(Hash *)((long)&create_info->pStages->sType + lVar8));
        if (bVar2) {
          bVar7 = true;
          goto LAB_0011205a;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x30;
      } while (uVar9 < create_info->stageCount);
    }
    bVar7 = false;
LAB_0011205a:
    local_40 = this;
    bVar2 = true;
    if (create_info->stageCount != 0) {
      lVar8 = 0x18;
      uVar9 = 0;
      do {
        local_48 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar8);
        sVar3 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->banned_modules)._M_h,(key_type *)&local_48);
        if (sVar3 != 0) {
          bVar2 = false;
          break;
        }
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0x30;
        bVar2 = bVar7;
      } while (uVar9 < create_info->stageCount);
    }
    if ((create_info->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) &&
       (pVVar6 = create_info->pLibraryInfo, pVVar6->libraryCount != 0)) {
      this_00 = &local_40->banned_raytracing;
      this_01 = &local_40->raytracing_pipelines;
      uVar9 = 0;
      bVar7 = false;
      do {
        local_48 = pVVar6->pLibraries[uVar9];
        sVar3 = std::
                _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&this_00->_M_h,(key_type *)&local_48);
        if (sVar3 != 0) {
          bVar2 = false;
          break;
        }
        if (!bVar7) {
          local_48 = create_info->pLibraryInfo->pLibraries[uVar9];
          sVar4 = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count(&this_01->_M_h,(key_type *)&local_48);
          if (sVar4 != 0) {
            bVar7 = true;
          }
        }
        bVar1 = bVar7;
        if (!bVar2) {
          bVar1 = bVar2;
        }
        if (create_info->stageCount != 0) {
          bVar1 = bVar2;
        }
        bVar2 = bVar1;
        uVar9 = uVar9 + 1;
        pVVar6 = create_info->pLibraryInfo;
      } while (uVar9 < pVVar6->libraryCount);
    }
    this = local_40;
    if (((create_info->flags & 0x800) != 0) && (create_info->stageCount == 0)) {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  lVar8 = 0x3f8;
  if ((bVar2) || (lVar8 = 0x468, (create_info->flags & 0x800) != 0)) {
    ppVVar5 = std::__detail::
              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)((long)&(this->super_StateCreatorInterface).
                                      _vptr_StateCreatorInterface + lVar8),&local_38);
    *ppVVar5 = create_info;
  }
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);
		bool allow_pipeline = false;

		if (filter_object(RESOURCE_RAYTRACING_PIPELINE, hash))
		{
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (filter_shader_module((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = true;
					break;
				}
			}

			if (create_info->stageCount == 0)
				allow_pipeline = true;

			// Need to test this as well, if there is at least one banned module used, we don't allow the pipeline.
			for (uint32_t i = 0; i < create_info->stageCount; i++)
			{
				if (banned_modules.count((Hash) create_info->pStages[i].module))
				{
					allow_pipeline = false;
					break;
				}
			}

			if (create_info->pLibraryInfo)
			{
				bool has_default_allowed_library = false;
				for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				{
					if (banned_raytracing.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						allow_pipeline = false;
						break;
					}

					if (!has_default_allowed_library &&
					    raytracing_pipelines.count((Hash) create_info->pLibraryInfo->pLibraries[i]))
					{
						has_default_allowed_library = true;
					}

					// At least one of the dependent libraries must be considered allowed to pass.
					if (create_info->stageCount == 0 && allow_pipeline)
						allow_pipeline = has_default_allowed_library;
				}
			}

			// Never include libraries by default unless they contain real code.
			if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && create_info->stageCount == 0)
				allow_pipeline = false;
		}

		// Need to defer this since we need to access pipeline libraries.
		if (allow_pipeline)
			raytracing_pipelines[hash] = create_info;
		else if ((create_info->flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0)
			library_raytracing_pipelines[hash] = create_info;

		return true;
	}